

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O1

bool Inferences::Superposition::checkSuperpositionFromVariable
               (Clause *eqClause,Literal *eqLit,TermList eqLHS)

{
  Term *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  TermList arg;
  TermList local_38;
  
  bVar7 = (*(ulong *)&eqClause->field_0x38 & 0xfffff) == 0;
  if (!bVar7) {
    uVar4 = (ulong)((uint)*(ulong *)&eqClause->field_0x38 & 0xfffff);
    uVar6 = 0;
    do {
      this = &eqClause->_literals[uVar6]->super_Term;
      if (this == &eqLit->super_Term) {
        bVar2 = false;
      }
      else if (this->_functor == 0) {
        iVar3 = 1;
        lVar5 = 0;
        bVar1 = false;
        do {
          local_38._content =
               this->_args[(ulong)(*(uint *)&this->field_0xc & 0xfffffff) + lVar5]._content;
          if (((local_38._content & 3) == 0) &&
             (bVar2 = Kernel::TermList::containsSubterm(&local_38,eqLHS), bVar2)) break;
          lVar5 = lVar5 + -1;
          iVar3 = iVar3 + -1;
          bVar1 = iVar3 != 0;
        } while (iVar3 == 0);
        bVar2 = true;
        if (bVar1) goto LAB_00520d36;
      }
      else {
        bVar1 = Kernel::Term::containsSubterm(this,eqLHS);
        bVar2 = true;
        if (!bVar1) {
LAB_00520d36:
          bVar2 = false;
        }
      }
      if (bVar2) {
        return bVar7;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar4 <= uVar6;
    } while (uVar6 != uVar4);
  }
  return bVar7;
}

Assistant:

bool Superposition::checkSuperpositionFromVariable(Clause* eqClause, Literal* eqLit, TermList eqLHS)
{
  ASS(eqLHS.isVar());
  //if we should do rewriting, LHS cannot appear inside RHS
  //ASS_REP(!EqHelper::getOtherEqualitySide(eqLit, eqLHS).containsSubterm(eqLHS), eqLit->toString());

  unsigned clen = eqClause->length();
  for(unsigned i=0; i<clen; i++) {
    Literal* lit = (*eqClause)[i];
    if(lit==eqLit) {
      continue;
    }
    if(lit->isEquality()) {
      for(unsigned aIdx=0; aIdx<2; aIdx++) {
	TermList arg = *lit->nthArgument(aIdx);
	if(arg.isTerm() && arg.containsSubterm(eqLHS)) {
	  return false;
	}
      }
    }
    else if(lit->containsSubterm(eqLHS)) {
      return false;
    }
  }

  return true;
}